

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::
ParseVectorDelimiters<flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__0>
          (Parser *this,size_t *count,anon_class_40_5_38b0cb7f body)

{
  bool bVar1;
  long *in_RDX;
  size_t *count_local;
  Parser *this_local;
  CheckedError *ce;
  
  Expect(this,(int)count);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    while ((((*(byte *)((long)count + 0x3ea) & 1) != 0 && (*in_RDX != 0)) ||
           (bVar1 = Is((Parser *)count,0x5d), !bVar1))) {
      ParseVector::anon_class_40_5_38b0cb7f::operator()
                ((anon_class_40_5_38b0cb7f *)this,(size_t *)&body);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_00121a02;
      CheckedError::~CheckedError((CheckedError *)this);
      *in_RDX = *in_RDX + 1;
      bVar1 = Is((Parser *)count,0x5d);
      if (bVar1) break;
      ParseComma(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_00121a02;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      anon_unknown_0::NoError();
    }
  }
LAB_00121a02:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseVectorDelimiters(size_t &count, F body) {
  EXPECT('[');
  for (;;) {
    if ((!opts.strict_json || !count) && Is(']')) break;
    ECHECK(body(count));
    count++;
    if (Is(']')) break;
    ECHECK(ParseComma());
  }
  NEXT();
  return NoError();
}